

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

void __thiscall
QCommandLineOption::setDefaultValues(QCommandLineOption *this,QStringList *defaultValues)

{
  QList<QString> *in_RSI;
  QList<QString> *this_00;
  
  this_00 = in_RSI;
  QSharedDataPointer<QCommandLineOptionPrivate>::operator->
            ((QSharedDataPointer<QCommandLineOptionPrivate> *)in_RSI);
  QList<QString>::operator=(this_00,in_RSI);
  return;
}

Assistant:

void QCommandLineOption::setDefaultValues(const QStringList &defaultValues)
{
    d->defaultValues = defaultValues;
}